

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantUtil.hpp
# Opt level: O0

void __thiscall
vkt::pipeline::GraphicsPipelineBuilder::GraphicsPipelineBuilder(GraphicsPipelineBuilder *this)

{
  GraphicsPipelineBuilder *this_local;
  
  tcu::Vector<int,_2>::Vector(&this->m_renderSize,0x10,0x10);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_vertexShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_fragmentShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_geometryShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_tessControlShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_tessEvaluationShaderModule)
  ;
  std::
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::vector(&this->m_shaderStages);
  this->m_shaderStageFlags = 0;
  return;
}

Assistant:

GraphicsPipelineBuilder			(void) : m_renderSize		(16, 16)
																							   , m_shaderStageFlags	(0u) {}